

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

int __thiscall phosg::Subprocess::kill(Subprocess *this,__pid_t __pid,int __sig)

{
  int iVar1;
  runtime_error *this_00;
  uint *puVar2;
  int error;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  __pid_t local_14;
  Subprocess *pSStack_10;
  int signum_local;
  Subprocess *this_local;
  
  local_14 = __pid;
  pSStack_10 = this;
  iVar1 = ::kill(this->child_pid,__pid);
  if (iVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    puVar2 = (uint *)__errno_location();
    string_for_error_abi_cxx11_(&local_58,(phosg *)(ulong)*puVar2,error);
    ::std::operator+(&local_38,"kill failed: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58)
    ;
    ::std::runtime_error::runtime_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  return 0;
}

Assistant:

void Subprocess::kill(int signum) {
  if (::kill(this->child_pid, signum)) {
    throw runtime_error("kill failed: " + string_for_error(errno));
  }
}